

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O2

MessageModule * __thiscall
ki::protocol::dml::MessageManager::load_module(MessageManager *this,string *filepath)

{
  char cVar1;
  bool bVar2;
  ostringstream oVar3;
  byte bVar4;
  long lVar5;
  char *text;
  MessageModule *pMVar6;
  Record *this_00;
  Field<unsigned_char> *pFVar7;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar8;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar9;
  xml_node<char> *pxVar10;
  MessageTemplate *pMVar11;
  xml_node<char> *this_01;
  size_type sVar12;
  size_type sVar13;
  value_error *pvVar14;
  ostream *poVar15;
  char *pcVar16;
  ulong uVar17;
  MessageModule *message_module;
  string message_name;
  string sStack_105b8;
  string sStack_10598;
  string sStack_10578;
  string sStack_10558;
  string sStack_10538;
  string asStack_10518 [2];
  string sStack_104d8;
  ostringstream oss_1;
  undefined7 uStack_104b7;
  char acStack_104a8 [16];
  MessageModule *pMStack_10498;
  string sStack_10340;
  string sStack_10320;
  string sStack_10300;
  string sStack_102e0;
  ifstream ifs;
  xml_document<char> doc;
  
  std::ifstream::ifstream(&ifs,(string *)filepath,_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&doc);
    poVar15 = std::operator<<((ostream *)&doc,"Could not open file: ");
    std::operator<<(poVar15,(string *)filepath);
    pvVar14 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    value_error::value_error(pvVar14,&sStack_104d8,MISSING_FILE);
    __cxa_throw(pvVar14,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = std::istream::tellg();
  std::istream::seekg((long)&ifs,_S_beg);
  uVar17 = 0xffffffffffffffff;
  if (lVar5 + 1U != 0) {
    uVar17 = lVar5 + 1U;
  }
  text = (char *)operator_new__(uVar17);
  *text = '\0';
  memset(text + 1,0,uVar17 - 1);
  std::istream::read((char *)&ifs,(long)text);
  doc.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  doc.super_xml_node<char>.m_type = node_document;
  doc.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  doc.super_memory_pool<char>.m_end = (char *)&doc.super_memory_pool<char>.m_alloc_func;
  doc.super_memory_pool<char>.m_begin = doc.super_memory_pool<char>.m_static_memory;
  doc.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  doc.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  doc.super_memory_pool<char>.m_ptr = doc.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>(&doc,text);
  pMVar6 = (MessageModule *)operator_new(200);
  std::__cxx11::string::string((string *)&sStack_105b8,"",(allocator *)&oss_1);
  MessageModule::MessageModule(pMVar6,'\0',&sStack_105b8);
  std::__cxx11::string::~string((string *)&sStack_105b8);
  this_01 = (doc.super_xml_node<char>.m_first_node)->m_first_node;
  message_module = pMVar6;
  while( true ) {
    if (this_01 == (xml_node<char> *)0x0) break;
    pxVar10 = this_01->m_first_node;
    if (pxVar10 != (xml_node<char> *)0x0) {
      this_00 = (Record *)operator_new(0x50);
      ki::dml::Record::Record(this_00);
      ki::dml::Record::from_xml(this_00,pxVar10);
      pcVar16 = (this_01->super_xml_base<char>).m_name;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&message_name,pcVar16,(allocator *)&oss_1);
      bVar2 = std::operator==(&message_name,"_ProtocolInfo");
      if (bVar2) {
        std::__cxx11::string::string((string *)&sStack_102e0,"ServiceID",(allocator *)&oss_1);
        pFVar7 = ki::dml::Record::get_field<unsigned_char>(this_00,&sStack_102e0);
        std::__cxx11::string::~string((string *)&sStack_102e0);
        std::__cxx11::string::string((string *)&sStack_10300,"ProtocolType",(allocator *)&oss_1);
        pFVar8 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,&sStack_10300);
        std::__cxx11::string::~string((string *)&sStack_10300);
        std::__cxx11::string::string
                  ((string *)&sStack_10320,"ProtocolDescription",(allocator *)&oss_1);
        pFVar9 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,&sStack_10320);
        std::__cxx11::string::~string((string *)&sStack_10320);
        if (pFVar7 != (Field<unsigned_char> *)0x0) {
          MessageModule::set_service_id(pMVar6,pFVar7->m_value);
        }
        if (pFVar8 != (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) {
          std::__cxx11::string::string((string *)asStack_10518,(string *)&pFVar8->m_value);
          MessageModule::set_protocol_type(pMVar6,asStack_10518);
          std::__cxx11::string::~string((string *)asStack_10518);
        }
        if (pFVar9 != (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) {
          std::__cxx11::string::string((string *)&sStack_10340,(string *)&pFVar9->m_value);
          MessageModule::set_protocol_description(pMVar6,&sStack_10340);
          std::__cxx11::string::~string((string *)&sStack_10340);
        }
      }
      else {
        pxVar10 = rapidxml::xml_node<char>::next_sibling(this_01,(char *)0x0,0,true);
        std::__cxx11::string::string((string *)&sStack_10538,(string *)&message_name);
        pMVar11 = MessageModule::add_message_template
                            (pMVar6,&sStack_10538,this_00,pxVar10 == (xml_node<char> *)0x0);
        std::__cxx11::string::~string((string *)&sStack_10538);
        if (pMVar11 == (MessageTemplate *)0x0) {
          operator_delete__(text);
          MessageModule::~MessageModule(pMVar6);
          operator_delete(pMVar6);
          ki::dml::Record::~Record(this_00);
          operator_delete(this_00);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
          std::operator<<((ostream *)&oss_1,"Failed to create message template for ");
          std::operator<<((ostream *)&oss_1,(string *)&message_name);
          pvVar14 = (value_error *)__cxa_allocate_exception(0x18);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar14,&sStack_10558,NONE);
          __cxa_throw(pvVar14,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::string::~string((string *)&message_name);
    }
    this_01 = rapidxml::xml_node<char>::next_sibling(this_01,(char *)0x0,0,true);
  }
  oVar3 = (ostringstream)MessageModule::get_service_id(pMVar6);
  oss_1 = oVar3;
  sVar12 = std::
           map<unsigned_char,_ki::protocol::dml::MessageModule_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
           ::count(&this->m_service_id_map,(key_type *)&oss_1);
  if (sVar12 == 1) {
    operator_delete__(text);
    MessageModule::~MessageModule(pMVar6);
    operator_delete(pMVar6);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::operator<<((ostream *)&oss_1,"Message Module has already been loaded with Service ID ");
    bVar4 = MessageModule::get_service_id(pMVar6);
    std::ostream::operator<<(&oss_1,(ushort)bVar4);
    pvVar14 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    value_error::value_error(pvVar14,&sStack_10578,OVERWRITES_LOOKUP);
    __cxa_throw(pvVar14,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  MessageModule::get_protocol_type_abi_cxx11_((string *)&oss_1,pMVar6);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
           ::count(&this->m_protocol_type_map,(key_type *)&oss_1);
  std::__cxx11::string::~string((string *)&oss_1);
  if (sVar13 != 1) {
    std::
    vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
    ::push_back(&this->m_modules,&message_module);
    oss_1 = (ostringstream)MessageModule::get_service_id(message_module);
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>>
    ::_M_insert_unique<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>
              ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>>
                *)&this->m_service_id_map,
               (pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*> *)&oss_1);
    MessageModule::get_protocol_type_abi_cxx11_(&message_name,message_module);
    _oss_1 = acStack_104a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_name._M_dataplus._M_p == &message_name.field_2) {
      acStack_104a8[8] = message_name.field_2._8_1_;
      acStack_104a8[9] = message_name.field_2._9_1_;
      acStack_104a8[10] = message_name.field_2._10_1_;
      acStack_104a8[0xb] = message_name.field_2._11_1_;
      acStack_104a8[0xc] = message_name.field_2._12_1_;
      acStack_104a8[0xd] = message_name.field_2._13_1_;
      acStack_104a8[0xe] = message_name.field_2._14_1_;
      acStack_104a8[0xf] = message_name.field_2._15_1_;
    }
    else {
      _oss_1 = message_name._M_dataplus._M_p;
    }
    message_name._M_string_length = 0;
    message_name.field_2._M_local_buf[0] = '\0';
    pMStack_10498 = message_module;
    message_name._M_dataplus._M_p = (pointer)&message_name.field_2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>>
                *)&this->m_protocol_type_map,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
                *)&oss_1);
    std::__cxx11::string::~string((string *)&oss_1);
    std::__cxx11::string::~string((string *)&message_name);
    operator_delete__(text);
    pMVar6 = message_module;
    rapidxml::memory_pool<char>::~memory_pool(&doc.super_memory_pool<char>);
    std::ifstream::~ifstream(&ifs);
    return pMVar6;
  }
  operator_delete__(text);
  MessageModule::~MessageModule(pMVar6);
  operator_delete(pMVar6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
  std::operator<<((ostream *)&oss_1,"Message Module has already been loaded with Protocol Type ");
  MessageModule::get_protocol_type_abi_cxx11_(&message_name,pMVar6);
  std::operator<<((ostream *)&oss_1,(string *)&message_name);
  std::__cxx11::string::~string((string *)&message_name);
  pvVar14 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(pvVar14,&sStack_10598,OVERWRITES_LOOKUP);
  __cxa_throw(pvVar14,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const MessageModule *MessageManager::load_module(std::string filepath)
	{
		// Open the file
		std::ifstream ifs(filepath, std::ios::ate);
		if (!ifs.is_open())
		{
			std::ostringstream oss;
			oss << "Could not open file: " << filepath;
			throw value_error(oss.str(), value_error::MISSING_FILE);
		}

		// Load contents into memory
		size_t size = ifs.tellg();
		ifs.seekg(0, std::ios::beg);
		char *data = new char[size + 1] { 0 };
		ifs.read(data, size);

		// Parse the contents
		rapidxml::xml_document<> doc;
		try
		{
			doc.parse<0>(data);
		}
		catch (rapidxml::parse_error &e)
		{
			delete[] data;

			std::ostringstream oss;
			oss << "Failed to parse: " << filepath;
			throw parse_error(oss.str(), parse_error::INVALID_XML_DATA);
		}

		// It's safe to allocate the module we're working on now
		auto *message_module = new MessageModule();

		// Get the root node and iterate through children
		// Each child is a MessageTemplate
		auto *root = doc.first_node();
		for (auto *node = root->first_node();
			node; node = node->next_sibling())
		{
			// Parse the record node inside this node
			auto *record_node = node->first_node();
			if (!record_node)
				continue;
			auto *record = new ki::dml::Record();
			record->from_xml(record_node);

			// The message name is initially based on the element name
			const std::string message_name = node->name();
			if (message_name == "_ProtocolInfo")
			{
				auto *service_id_field = record->get_field<ki::dml::UBYT>("ServiceID");
				auto *type_field = record->get_field<ki::dml::STR>("ProtocolType");
				auto *description_field = record->get_field<ki::dml::STR>("ProtocolDescription");

				// Set the module metadata from this template
				if (service_id_field)
					message_module->set_service_id(service_id_field->get_value());
				if (type_field)
					message_module->set_protocol_type(type_field->get_value());
				if (description_field)
					message_module->set_protocol_description(description_field->get_value());
			}
			else
			{
				// Only do sorting after we've reached the final message
				// This only affects modules that aren't ordered with _MsgOrder.
				const bool auto_sort = node->next_sibling() == nullptr;

				// The template will use the record itself to figure out name and type;
				// we only give the XML data incase the record doesn't have it defined.
				auto *message_template = message_module->add_message_template(message_name, record, auto_sort);
				if (!message_template)
				{
					delete[] data;
					delete message_module;
					delete record;

					std::ostringstream oss;
					oss << "Failed to create message template for ";
					oss << message_name;
					throw value_error(oss.str());
				}
			}
		}

		// Make sure we aren't overwriting another module
		if (m_service_id_map.count(message_module->get_service_id()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Service ID ";
			oss << (uint16_t)message_module->get_service_id();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		if (m_protocol_type_map.count(message_module->get_protocol_type()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Protocol Type ";
			oss << message_module->get_protocol_type();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		// Add it to our maps
		m_modules.push_back(message_module);
		m_service_id_map.insert({ message_module->get_service_id(), message_module });
		m_protocol_type_map.insert({ message_module->get_protocol_type(), message_module });

		delete[] data;
		return message_module;
	}